

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimemagicrule.cpp
# Opt level: O0

void __thiscall
QMimeMagicRule::QMimeMagicRule
          (QMimeMagicRule *this,QString *type,QByteArray *value,QString *offsets,QByteArray *mask,
          QString *errorString)

{
  QByteArrayView bv;
  QStringView n;
  QStringView n_00;
  bool bVar1;
  unsigned_short uVar2;
  Type TVar3;
  uint uVar4;
  uint uVar5;
  qsizetype qVar6;
  qsizetype qVar7;
  long in_RDI;
  QByteArray *this_00;
  long in_R9;
  long in_FS_OFFSET;
  QByteArray *tempMask;
  qsizetype colonIndex;
  char16_t *str;
  bool ok;
  QStringView endPosStr;
  QStringView startPosStr;
  undefined4 in_stack_fffffffffffffb58;
  CaseSensitivity in_stack_fffffffffffffb5c;
  undefined4 in_stack_fffffffffffffb60;
  int in_stack_fffffffffffffb64;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  char ch;
  undefined4 in_stack_fffffffffffffb80;
  undefined2 in_stack_fffffffffffffb84;
  undefined2 in_stack_fffffffffffffb86;
  undefined2 in_stack_fffffffffffffb88;
  undefined2 in_stack_fffffffffffffb8a;
  undefined2 in_stack_fffffffffffffb8c;
  QChar in_stack_fffffffffffffb8e;
  undefined6 in_stack_fffffffffffffbc8;
  undefined1 in_stack_fffffffffffffbce;
  undefined1 in_stack_fffffffffffffbcf;
  byte bVar8;
  uint local_418;
  undefined8 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  QByteArray local_2b0;
  undefined2 local_292;
  QLatin1StringView local_280;
  undefined2 local_20a;
  QLatin1StringView local_1f8;
  byte local_1a9;
  QArrayDataPointer<char16_t> local_1a8 [2];
  qsizetype local_178;
  storage_type_conflict *psStack_170;
  qsizetype local_168;
  storage_type_conflict *psStack_160;
  QStringView local_148;
  QStringView local_128;
  QChar local_112;
  QLatin1StringView local_110;
  QLatin1StringView local_100;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QMimeMagicRule>::QList((QList<QMimeMagicRule> *)0x8f38bc);
  QString::toLatin1((QString *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  TVar3 = QMimeMagicRule::type
                    ((QByteArray *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  QByteArray::~QByteArray((QByteArray *)0x8f3910);
  *(Type *)(in_RDI + 0x18) = TVar3;
  QByteArray::QByteArray
            ((QByteArray *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             (QByteArray *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  QByteArray::QByteArray
            ((QByteArray *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             (QByteArray *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  QByteArray::QByteArray((QByteArray *)0x8f397c);
  *(undefined8 *)(in_RDI + 0x80) = 0;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  if (*(int *)(in_RDI + 0x18) == 0) {
    if (in_R9 != 0) {
      local_100 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
      ::operator+((QLatin1String *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                  (QString *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      local_110 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
      ::operator+((QStringBuilder<QLatin1String,_const_QString_&> *)
                  CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                  (QLatin1String *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String> *)
                 CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                         (QString *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      QString::~QString((QString *)0x8f3a73);
    }
    goto switchD_008f3f7a_default;
  }
  QChar::QChar<char16_t,_true>(&local_112,L':');
  QString::indexOf((QString *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                   in_stack_fffffffffffffb8e,
                   CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   in_stack_fffffffffffffb5c);
  local_128.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  local_128.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
             (QString *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  local_128 = QStringView::mid((QStringView *)
                               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                               CONCAT26(in_stack_fffffffffffffb8e.ucs,
                                        CONCAT24(in_stack_fffffffffffffb8c,
                                                 CONCAT22(in_stack_fffffffffffffb8a,
                                                          in_stack_fffffffffffffb88))),
                               CONCAT26(in_stack_fffffffffffffb86,
                                        CONCAT24(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80
                                                )));
  local_148.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  local_148.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
             (QString *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  local_148 = QStringView::mid((QStringView *)
                               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                               CONCAT26(in_stack_fffffffffffffb8e.ucs,
                                        CONCAT24(in_stack_fffffffffffffb8c,
                                                 CONCAT22(in_stack_fffffffffffffb8a,
                                                          in_stack_fffffffffffffb88))),
                               CONCAT26(in_stack_fffffffffffffb86,
                                        CONCAT24(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80
                                                )));
  ch = (char)((uint)in_stack_fffffffffffffb7c >> 0x18);
  local_168 = local_128.m_size;
  psStack_160 = local_128.m_data;
  n.m_data._0_4_ = in_stack_fffffffffffffbf8;
  n.m_size = in_stack_fffffffffffffbf0;
  n.m_data._4_4_ = in_stack_fffffffffffffbfc;
  bVar1 = QMimeTypeParserBase::parseNumber
                    (n,(int *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                     (QString *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_178 = local_148.m_size;
    psStack_170 = local_148.m_data;
    n_00.m_data._0_4_ = in_stack_fffffffffffffbf8;
    n_00.m_size = in_stack_fffffffffffffbf0;
    n_00.m_data._4_4_ = in_stack_fffffffffffffbfc;
    bVar1 = QMimeTypeParserBase::parseNumber
                      (n_00,(int *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                       (QString *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar1 = QByteArray::isEmpty((QByteArray *)0x8f3c91);
      if (bVar1) {
        *(undefined4 *)(in_RDI + 0x18) = 0;
        if (in_R9 != 0) {
          QArrayDataPointer<char16_t>::QArrayDataPointer
                    (local_1a8,(Data *)0x0,L"Invalid empty magic rule value",0x1e);
          QString::QString((QString *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                           (DataPointer *)
                           CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
          QString::operator=((QString *)
                             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
          QString::~QString((QString *)0x8f3d42);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)
                     CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
        }
      }
      else {
        if ((1 < *(int *)(in_RDI + 0x18)) && (*(int *)(in_RDI + 0x18) < 9)) {
          local_1a9 = 0xaa;
          uVar4 = QByteArray::toUInt((QByteArray *)
                                     CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                                     (bool *)CONCAT44(in_stack_fffffffffffffb6c,
                                                      in_stack_fffffffffffffb68),
                                     in_stack_fffffffffffffb64);
          *(uint *)(in_RDI + 0x70) = uVar4;
          if (((local_1a9 ^ 0xff) & 1) != 0) {
            *(undefined4 *)(in_RDI + 0x18) = 0;
            if (in_R9 != 0) {
              local_1f8 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)CONCAT44(in_stack_fffffffffffffb6c,
                                                      in_stack_fffffffffffffb68),
                                     CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
              QLatin1String::QLatin1String
                        ((QLatin1String *)
                         CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                         (QByteArray *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68)
                        );
              ::operator+((QLatin1String *)
                          CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                          (QLatin1String *)
                          CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
              local_20a = 0x22;
              ::operator+((QStringBuilder<QLatin1String,_QLatin1String> *)
                          CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                          (char16_t *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58))
              ;
              ::QStringBuilder::operator_cast_to_QString
                        ((QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t> *)
                         CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
              QString::operator=((QString *)
                                 CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
              QString::~QString((QString *)0x8f3ed9);
            }
            goto switchD_008f3f7a_default;
          }
          bVar1 = QByteArray::isEmpty((QByteArray *)0x8f3eef);
          if (bVar1) {
            local_418 = 0;
          }
          else {
            local_418 = QByteArray::toUInt((QByteArray *)
                                           CONCAT44(in_stack_fffffffffffffb74,
                                                    in_stack_fffffffffffffb70),
                                           (bool *)CONCAT44(in_stack_fffffffffffffb6c,
                                                            in_stack_fffffffffffffb68),
                                           in_stack_fffffffffffffb64);
          }
          *(uint *)(in_RDI + 0x74) = local_418;
        }
        switch(*(undefined4 *)(in_RDI + 0x18)) {
        case 1:
          makePattern((QByteArray *)
                      CONCAT17(in_stack_fffffffffffffbcf,
                               CONCAT16(in_stack_fffffffffffffbce,in_stack_fffffffffffffbc8)));
          QByteArray::operator=
                    ((QByteArray *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
          QByteArray::~QByteArray((QByteArray *)0x8f3fc8);
          QByteArray::squeeze((QByteArray *)
                              CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
          bVar1 = QByteArray::isEmpty((QByteArray *)0x8f3fe8);
          if (bVar1) {
            QByteArray::size((QByteArray *)(in_RDI + 0x58));
            QByteArray::fill((QByteArray *)
                             CONCAT26(in_stack_fffffffffffffb86,
                                      CONCAT24(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80))
                             ,ch,CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
          }
          else {
            qVar6 = QByteArray::size((QByteArray *)(in_RDI + 0x40));
            bVar8 = 1;
            if (3 < qVar6) {
              QByteArrayView::QByteArrayView<3ul>
                        ((QByteArrayView *)
                         CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                         (char (*) [3])CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68)
                        );
              bv.m_size._4_2_ = in_stack_fffffffffffffb84;
              bv.m_size._0_4_ = in_stack_fffffffffffffb80;
              bv.m_size._6_2_ = in_stack_fffffffffffffb86;
              bv.m_data._0_2_ = in_stack_fffffffffffffb88;
              bv.m_data._2_2_ = in_stack_fffffffffffffb8a;
              bv.m_data._4_2_ = in_stack_fffffffffffffb8c;
              bv.m_data._6_2_ = in_stack_fffffffffffffb8e.ucs;
              bVar1 = QByteArray::startsWith
                                ((QByteArray *)
                                 CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),bv);
              bVar8 = bVar1 ^ 0xff;
            }
            if ((bVar8 & 1) != 0) {
              *(undefined4 *)(in_RDI + 0x18) = 0;
              if (in_R9 != 0) {
                local_280 = Qt::Literals::StringLiterals::operator____L1
                                      ((char *)CONCAT44(in_stack_fffffffffffffb6c,
                                                        in_stack_fffffffffffffb68),
                                       CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60)
                                      );
                QLatin1String::QLatin1String
                          ((QLatin1String *)
                           CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                           (QByteArray *)
                           CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
                ::operator+((QLatin1String *)
                            CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                            (QLatin1String *)
                            CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
                local_292 = 0x22;
                ::operator+((QStringBuilder<QLatin1String,_QLatin1String> *)
                            CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                            (char16_t *)
                            CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
                ::QStringBuilder::operator_cast_to_QString
                          ((QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t> *
                           )CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
                QString::operator=((QString *)
                                   CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                                   (QString *)
                                   CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
                QString::~QString((QString *)0x8f414b);
              }
              break;
            }
            this_00 = (QByteArray *)(in_RDI + 0x40);
            QByteArray::constData((QByteArray *)0x8f4178);
            QByteArray::size(this_00);
            QByteArray::fromRawData
                      ((char *)CONCAT26(in_stack_fffffffffffffb8e.ucs,
                                        CONCAT24(in_stack_fffffffffffffb8c,
                                                 CONCAT22(in_stack_fffffffffffffb8a,
                                                          in_stack_fffffffffffffb88))),
                       CONCAT26(in_stack_fffffffffffffb86,
                                CONCAT24(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80)));
            QByteArray::fromHex(this_00);
            QByteArray::~QByteArray((QByteArray *)0x8f41ca);
            qVar6 = QByteArray::size(&local_2b0);
            qVar7 = QByteArray::size((QByteArray *)(in_RDI + 0x58));
            if (qVar6 == qVar7) {
              QByteArray::operator=
                        ((QByteArray *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60)
                         ,(QByteArray *)
                          CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
              bVar1 = false;
            }
            else {
              *(undefined4 *)(in_RDI + 0x18) = 0;
              if (in_R9 != 0) {
                Qt::Literals::StringLiterals::operator____L1
                          ((char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                           CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
                QLatin1String::QLatin1String
                          ((QLatin1String *)
                           CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                           (QByteArray *)
                           CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
                ::operator+((QLatin1String *)
                            CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                            (QLatin1String *)
                            CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
                ::operator+((QStringBuilder<QLatin1String,_QLatin1String> *)
                            CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                            (char16_t *)
                            CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
                ::QStringBuilder::operator_cast_to_QString
                          ((QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t> *
                           )CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
                QString::operator=((QString *)
                                   CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                                   (QString *)
                                   CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
                QString::~QString((QString *)0x8f42f3);
              }
              bVar1 = true;
            }
            QByteArray::~QByteArray((QByteArray *)0x8f4387);
            if (bVar1) break;
          }
          QByteArray::squeeze((QByteArray *)
                              CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
          *(code **)(in_RDI + 0x78) = matchString;
          *(undefined8 *)(in_RDI + 0x80) = 0;
          break;
        case 4:
        case 6:
          if (*(uint *)(in_RDI + 0x70) < 0x10000) {
            if (*(int *)(in_RDI + 0x18) == 6) {
              uVar2 = qFromLittleEndian<unsigned_short>(*(unsigned_short *)(in_RDI + 0x70));
            }
            else {
              uVar2 = qFromBigEndian<unsigned_short>(0);
            }
            *(uint *)(in_RDI + 0x70) = (uint)uVar2;
            if (*(int *)(in_RDI + 0x74) != 0) {
              if (*(int *)(in_RDI + 0x18) == 6) {
                uVar2 = qFromLittleEndian<unsigned_short>(*(unsigned_short *)(in_RDI + 0x74));
              }
              else {
                uVar2 = qFromBigEndian<unsigned_short>(0);
              }
              *(uint *)(in_RDI + 0x74) = (uint)uVar2;
            }
          }
        case 2:
          if (*(uint *)(in_RDI + 0x70) < 0x10000) {
            if (*(int *)(in_RDI + 0x74) == 0) {
              *(undefined4 *)(in_RDI + 0x74) = 0xffff;
            }
            *(code **)(in_RDI + 0x78) = matchNumber<unsigned_short>;
            *(undefined8 *)(in_RDI + 0x80) = 0;
          }
          break;
        case 5:
        case 7:
          if (*(int *)(in_RDI + 0x18) == 7) {
            uVar5 = qFromLittleEndian<unsigned_int>(*(uint *)(in_RDI + 0x70));
          }
          else {
            uVar5 = qFromBigEndian<unsigned_int>(0);
          }
          *(uint *)(in_RDI + 0x70) = uVar5;
          if (*(int *)(in_RDI + 0x74) != 0) {
            if (*(int *)(in_RDI + 0x18) == 7) {
              uVar5 = qFromLittleEndian<unsigned_int>(*(uint *)(in_RDI + 0x74));
            }
            else {
              uVar5 = qFromBigEndian<unsigned_int>(0);
            }
            *(uint *)(in_RDI + 0x74) = uVar5;
          }
        case 3:
          if (*(int *)(in_RDI + 0x74) == 0) {
            *(undefined4 *)(in_RDI + 0x74) = 0xffffffff;
          }
          *(code **)(in_RDI + 0x78) = matchNumber<unsigned_int>;
          *(undefined8 *)(in_RDI + 0x80) = 0;
          break;
        case 8:
          if (*(uint *)(in_RDI + 0x70) < 0x100) {
            if (*(int *)(in_RDI + 0x74) == 0) {
              *(undefined4 *)(in_RDI + 0x74) = 0xff;
            }
            *(code **)(in_RDI + 0x78) = matchNumber<unsigned_char>;
            *(undefined8 *)(in_RDI + 0x80) = 0;
          }
        }
      }
      goto switchD_008f3f7a_default;
    }
  }
  *(undefined4 *)(in_RDI + 0x18) = 0;
switchD_008f3f7a_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QMimeMagicRule::QMimeMagicRule(const QString &type,
                               const QByteArray &value,
                               const QString &offsets,
                               const QByteArray &mask,
                               QString *errorString)
    : m_type(QMimeMagicRule::type(type.toLatin1())),
      m_value(value),
      m_mask(mask),
      m_matchFunction(nullptr)
{
    if (Q_UNLIKELY(m_type == Invalid)) {
        if (errorString)
            *errorString = "Type "_L1 + type + " is not supported"_L1;
        return;
    }

    // Parse for offset as "1" or "1:10"
    const qsizetype colonIndex = offsets.indexOf(u':');
    const QStringView startPosStr = QStringView{offsets}.mid(0, colonIndex); // \ These decay to returning 'offsets'
    const QStringView endPosStr   = QStringView{offsets}.mid(colonIndex + 1);// / unchanged when colonIndex == -1
    if (Q_UNLIKELY(!QMimeTypeParserBase::parseNumber(startPosStr, &m_startPos, errorString)) ||
        Q_UNLIKELY(!QMimeTypeParserBase::parseNumber(endPosStr, &m_endPos, errorString))) {
        m_type = Invalid;
        return;
    }

    if (Q_UNLIKELY(m_value.isEmpty())) {
        m_type = Invalid;
        if (errorString)
            *errorString = QStringLiteral("Invalid empty magic rule value");
        return;
    }

    if (m_type >= Host16 && m_type <= Byte) {
        bool ok;
        m_number = m_value.toUInt(&ok, 0); // autodetect base
        if (Q_UNLIKELY(!ok)) {
            m_type = Invalid;
            if (errorString)
                *errorString = "Invalid magic rule value \""_L1 + QLatin1StringView(m_value) + u'"';
            return;
        }
        m_numberMask = !m_mask.isEmpty() ? m_mask.toUInt(&ok, 0) : 0; // autodetect base
    }

    switch (m_type) {
    case String:
        m_pattern = makePattern(m_value);
        m_pattern.squeeze();
        if (!m_mask.isEmpty()) {
            if (Q_UNLIKELY(m_mask.size() < 4 || !m_mask.startsWith("0x"))) {
                m_type = Invalid;
                if (errorString)
                    *errorString = "Invalid magic rule mask \""_L1 + QLatin1StringView(m_mask) + u'"';
                return;
            }
            const QByteArray &tempMask = QByteArray::fromHex(QByteArray::fromRawData(
                                                     m_mask.constData() + 2, m_mask.size() - 2));
            if (Q_UNLIKELY(tempMask.size() != m_pattern.size())) {
                m_type = Invalid;
                if (errorString)
                    *errorString = "Invalid magic rule mask size \""_L1 + QLatin1StringView(m_mask) + u'"';
                return;
            }
            m_mask = tempMask;
        } else {
            m_mask.fill(char(-1), m_pattern.size());
        }
        m_mask.squeeze();
        m_matchFunction = &QMimeMagicRule::matchString;
        break;
    case Byte:
        if (m_number <= quint8(-1)) {
            if (m_numberMask == 0)
                m_numberMask = quint8(-1);
            m_matchFunction = &QMimeMagicRule::matchNumber<quint8>;
        }
        break;
    case Big16:
    case Little16:
        if (m_number <= quint16(-1)) {
            m_number = m_type == Little16 ? qFromLittleEndian<quint16>(m_number) : qFromBigEndian<quint16>(m_number);
            if (m_numberMask != 0)
                m_numberMask = m_type == Little16 ? qFromLittleEndian<quint16>(m_numberMask) : qFromBigEndian<quint16>(m_numberMask);
        }
        Q_FALLTHROUGH();
    case Host16:
        if (m_number <= quint16(-1)) {
            if (m_numberMask == 0)
                m_numberMask = quint16(-1);
            m_matchFunction = &QMimeMagicRule::matchNumber<quint16>;
        }
        break;
    case Big32:
    case Little32:
        m_number = m_type == Little32 ? qFromLittleEndian<quint32>(m_number) : qFromBigEndian<quint32>(m_number);
        if (m_numberMask != 0)
            m_numberMask = m_type == Little32 ? qFromLittleEndian<quint32>(m_numberMask) : qFromBigEndian<quint32>(m_numberMask);
        Q_FALLTHROUGH();
    case Host32:
        if (m_numberMask == 0)
            m_numberMask = quint32(-1);
        m_matchFunction = &QMimeMagicRule::matchNumber<quint32>;
        break;
    default:
        break;
    }
}